

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fPolygonOffsetTests.cpp
# Opt level: O3

void __thiscall
deqp::gles3::Functional::anon_unknown_0::UsageTestCase::testPolygonOffset(UsageTestCase *this)

{
  ostringstream *poVar1;
  TextureFormat TVar2;
  RenderContext *pRVar3;
  TestContext *testCtx;
  TextureFormat TVar4;
  int iVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 extraout_var;
  TestError *this_00;
  void *pvVar9;
  long lVar10;
  Renderer referenceRenderer;
  Surface referenceImage;
  Surface testImage;
  ProgramSources sources;
  ShaderProgram program;
  Renderer local_5d1;
  Surface local_5d0;
  Surface local_5b8;
  TextureFormat local_5a0;
  undefined1 local_598 [24];
  anon_union_16_3_1194ccdc_for_v aStack_580;
  undefined8 uStack_570;
  undefined8 local_568;
  undefined8 uStack_560;
  undefined8 local_558;
  undefined8 uStack_550;
  Program local_540;
  undefined8 local_528;
  undefined8 uStack_520;
  undefined8 local_518;
  undefined8 uStack_510;
  undefined8 local_508;
  undefined8 uStack_500;
  MultisamplePixelBufferAccess local_4f0;
  RenderState local_4c8;
  DrawCommand local_3d8;
  undefined1 local_3a0 [24];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_388 [4];
  ios_base local_328 [24];
  vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_> local_310;
  undefined1 local_2f0 [208];
  MultisamplePixelBufferAccess local_220;
  PixelBufferAccess local_1f8;
  MultisamplePixelBufferAccess local_1d0;
  undefined1 local_1a8 [344];
  PrimitiveList local_50;
  long lVar8;
  
  local_528 = 0x3f800000bf800000;
  uStack_520 = 0x3f80000000000000;
  local_518 = 0x3f8000003f800000;
  uStack_510 = 0x3f80000000000000;
  local_508 = 0xbf8000003f800000;
  uStack_500 = 0x3f80000000000000;
  TVar2 = (TextureFormat)
          ((this->super_PolygonOffsetTestCase).super_TestCase.super_TestCase.super_TestNode.
          m_testCtx)->m_log;
  iVar5 = (this->super_PolygonOffsetTestCase).m_targetSize;
  tcu::Surface::Surface(&local_5b8,iVar5,iVar5);
  iVar5 = (this->super_PolygonOffsetTestCase).m_targetSize;
  tcu::Surface::Surface(&local_5d0,iVar5,iVar5);
  iVar5 = (*((this->super_PolygonOffsetTestCase).super_TestCase.m_context)->m_renderCtx->
            _vptr_RenderContext[3])();
  lVar8 = CONCAT44(extraout_var,iVar5);
  pRVar3 = ((this->super_PolygonOffsetTestCase).super_TestCase.m_context)->m_renderCtx;
  local_5a0 = TVar2;
  local_4c8._0_8_ = (RasterizationState *)((long)&local_4c8 + 0x10U);
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_4c8,
             "#version 300 es\nin highp vec4 a_position;\nin highp vec4 a_color;\nout highp vec4 v_color;\nvoid main (void)\n{\n\tgl_Position = a_position;\n\tv_color = a_color;\n}\n"
             ,"");
  local_598._0_8_ = local_598 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_598,
             "#version 300 es\nin highp vec4 v_color;\nlayout(location = 0) out mediump vec4 fragColor;void main (void)\n{\n\tfragColor = v_color;\n}\n"
             ,"");
  memset((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)local_3a0,0,0xac);
  local_2f0._0_8_ = (pointer)0x0;
  local_2f0[8] = 0;
  local_2f0._9_7_ = 0;
  local_2f0[0x10] = 0;
  local_2f0._17_8_ = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_3a0,(value_type *)&local_4c8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(local_388,(value_type *)local_598);
  glu::ShaderProgram::ShaderProgram((ShaderProgram *)local_1a8,pRVar3,(ProgramSources *)local_3a0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_2f0);
  std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
            (&local_310);
  lVar10 = 0x78;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_3a0 + lVar10));
    lVar10 = lVar10 + -0x18;
  } while (lVar10 != -0x18);
  if ((undefined1 *)local_598._0_8_ != local_598 + 0x10) {
    operator_delete((void *)local_598._0_8_,local_598._16_8_ + 1);
  }
  TVar2 = local_5a0;
  if ((RasterizationState *)local_4c8._0_8_ != (RasterizationState *)((long)&local_4c8 + 0x10U)) {
    operator_delete((void *)local_4c8._0_8_,local_4c8.rasterization._8_8_ + 1);
  }
  uVar6 = (**(code **)(lVar8 + 0x780))(local_1a8._152_4_,"a_position");
  uVar7 = (**(code **)(lVar8 + 0x780))(local_1a8._152_4_,"a_color");
  if (local_1a8[0xc0] != false) {
    (**(code **)(lVar8 + 0x1c0))(0,0,0,0x3f800000);
    (**(code **)(lVar8 + 0x1d0))(0x3f800000);
    (**(code **)(lVar8 + 0x188))(0x4100);
    (**(code **)(lVar8 + 0x1a00))(0,0,(this->super_PolygonOffsetTestCase).m_targetSize);
    (**(code **)(lVar8 + 0x1680))(local_1a8._152_4_);
    (**(code **)(lVar8 + 0x5e0))(0xb71);
    (**(code **)(lVar8 + 0x4a0))(0x203);
    TVar4 = local_5a0;
    poVar1 = (ostringstream *)(local_3a0 + 8);
    local_5a0.order = TVar2.order;
    local_5a0.type = TVar2.type;
    local_3a0._0_4_ = local_5a0.order;
    local_3a0._4_4_ = local_5a0.type;
    local_5a0 = TVar4;
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"DepthFunc = GL_LEQUAL",0x15);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_3a0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_328);
    (**(code **)(lVar8 + 0x610))(uVar6);
    (**(code **)(lVar8 + 0x19f0))(uVar6,4,0x1406,0,0,&local_528);
    TVar4 = local_5a0;
    poVar1 = (ostringstream *)(local_3a0 + 8);
    local_5a0.order = TVar2.order;
    local_5a0.type = TVar2.type;
    local_3a0._0_4_ = local_5a0.order;
    local_3a0._4_4_ = local_5a0.type;
    local_5a0 = TVar4;
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,
               "Draw bottom-right. Color = White.\tState: PolygonOffset(0, -2), POLYGON_OFFSET_FILL disabled."
               ,0x5c);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_3a0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_328);
    (**(code **)(lVar8 + 0x1028))(0,0xc0000000);
    (**(code **)(lVar8 + 0x4e8))(0x8037);
    (**(code **)(lVar8 + 0x1858))(0x3f800000,0x3f800000,0x3f800000,0x3f800000,uVar7);
    (**(code **)(lVar8 + 0x538))(4,0,3);
    TVar4 = local_5a0;
    poVar1 = (ostringstream *)(local_3a0 + 8);
    local_5a0.order = TVar2.order;
    local_5a0.type = TVar2.type;
    local_3a0._0_4_ = local_5a0.order;
    local_3a0._4_4_ = local_5a0.type;
    local_5a0 = TVar4;
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,
               "Draw bottom-right. Color = Red.\tState: PolygonOffset(0, -1), POLYGON_OFFSET_FILL enabled."
               ,0x59);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_3a0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_328);
    (**(code **)(lVar8 + 0x1028))(0,0xbf800000);
    (**(code **)(lVar8 + 0x5e0))(0x8037);
    (**(code **)(lVar8 + 0x1858))(0x3f800000,0,0,0x3f800000,uVar7);
    (**(code **)(lVar8 + 0x538))(4,0,3);
    (**(code **)(lVar8 + 0x518))(uVar6);
    (**(code **)(lVar8 + 0x1680))(0);
    (**(code **)(lVar8 + 0x648))();
    pRVar3 = ((this->super_PolygonOffsetTestCase).super_TestCase.m_context)->m_renderCtx;
    local_4c8.cullMode = RGBA;
    local_4c8.provokingVertexConvention = UNORM_INT8;
    pvVar9 = (void *)local_5b8.m_pixels.m_cap;
    if ((void *)local_5b8.m_pixels.m_cap != (void *)0x0) {
      pvVar9 = local_5b8.m_pixels.m_ptr;
    }
    tcu::PixelBufferAccess::PixelBufferAccess
              ((PixelBufferAccess *)local_3a0,(TextureFormat *)&local_4c8,local_5b8.m_width,
               local_5b8.m_height,1,pvVar9);
    glu::readPixels(pRVar3,0,0,(PixelBufferAccess *)local_3a0);
    glu::ShaderProgram::~ShaderProgram((ShaderProgram *)local_1a8);
    rr::Renderer::Renderer(&local_5d1);
    local_558 = 0;
    uStack_550 = 0;
    local_568 = 0;
    uStack_560 = 0;
    aStack_580._8_8_ = 0;
    uStack_570 = 0;
    local_598._16_8_ = 0;
    aStack_580._0_8_ = 0;
    local_598._0_8_ = (pointer)0x0;
    local_598._8_8_ = 0;
    iVar5 = (this->super_PolygonOffsetTestCase).m_targetSize;
    local_4c8.cullMode = R;
    local_4c8.provokingVertexConvention = SNORM_INT16;
    local_4c8.rasterization.winding = WINDING_CCW;
    local_4c8.rasterization.horizontalFill = FILL_LEFT;
    local_4c8.rasterization.verticalFill = FILL_BOTTOM;
    local_4c8.rasterization.viewportOrientation = VIEWPORTORIENTATION_LAST;
    rr::FragmentOperationState::FragmentOperationState
              ((FragmentOperationState *)((long)&local_4c8 + 0x18));
    local_4c8.point.pointSize = 1.0;
    local_4c8.viewport.rect.left = 0;
    local_4c8.viewport.rect.bottom = 0;
    local_4c8.viewport.zn = 0.0;
    local_4c8.viewport.zf = 1.0;
    local_4c8.line.lineWidth = 1.0;
    local_4c8.restart.enabled = false;
    local_4c8.restart.restartIndex = 0xffffffff;
    local_4c8.viewportOrientation = VIEWPORTORIENTATION_LOWER_LEFT;
    local_4c8.rasterization._8_8_ = local_4c8.rasterization._8_8_ & 0xffffffff;
    local_4c8.viewport.rect.width = iVar5;
    local_4c8.viewport.rect.height = iVar5;
    PositionColorShader::PositionColorShader((PositionColorShader *)local_1a8);
    TVar2 = local_5a0;
    local_598._0_8_ = (pointer)0x400000000;
    local_598._8_8_ = 0;
    local_598._16_8_ = &local_528;
    uStack_570 = CONCAT44(uStack_570._4_4_,0x22);
    local_558 = 0x3f800000;
    uStack_550 = 0x3f80000000000000;
    local_3d8.state = (RenderState *)0x300000008;
    pvVar9 = (void *)local_5d0.m_pixels.m_cap;
    if ((void *)local_5d0.m_pixels.m_cap != (void *)0x0) {
      pvVar9 = local_5d0.m_pixels.m_ptr;
    }
    tcu::PixelBufferAccess::PixelBufferAccess
              ((PixelBufferAccess *)local_3a0,(TextureFormat *)&local_3d8,local_5d0.m_width,
               local_5d0.m_height,1,pvVar9);
    local_3d8.state = (RenderState *)0x0;
    local_3d8.renderTarget = (RenderTarget *)0x3f80000000000000;
    tcu::clear((PixelBufferAccess *)local_3a0,(Vec4 *)&local_3d8);
    TVar4 = local_5a0;
    poVar1 = (ostringstream *)(local_3a0 + 8);
    local_5a0.order = TVar2.order;
    local_5a0.type = TVar2.type;
    local_3a0._0_4_ = local_5a0.order;
    local_3a0._4_4_ = local_5a0.type;
    local_5a0 = TVar4;
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"Expecting: Bottom-right = Red.",0x1e);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_3a0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_328);
    local_4f0.m_access.super_ConstPixelBufferAccess.m_format.order = RGBA;
    local_4f0.m_access.super_ConstPixelBufferAccess.m_format.type = UNORM_INT8;
    pvVar9 = (void *)local_5d0.m_pixels.m_cap;
    if ((void *)local_5d0.m_pixels.m_cap != (void *)0x0) {
      pvVar9 = local_5d0.m_pixels.m_ptr;
    }
    tcu::PixelBufferAccess::PixelBufferAccess
              (&local_1f8,(TextureFormat *)&local_4f0,local_5d0.m_width,local_5d0.m_height,1,pvVar9)
    ;
    rr::MultisamplePixelBufferAccess::fromSinglesampleAccess(&local_1d0,&local_1f8);
    rr::MultisamplePixelBufferAccess::MultisamplePixelBufferAccess(&local_4f0);
    rr::MultisamplePixelBufferAccess::MultisamplePixelBufferAccess(&local_220);
    rr::RenderTarget::RenderTarget((RenderTarget *)local_3a0,&local_1d0,&local_4f0,&local_220);
    local_540.fragmentShader = (FragmentShader *)(local_1a8 + 0x88);
    local_540.geometryShader = (GeometryShader *)0x0;
    local_540.vertexShader = (VertexShader *)local_1a8;
    rr::PrimitiveList::PrimitiveList(&local_50,PRIMITIVETYPE_TRIANGLES,3,0);
    local_3d8.program = &local_540;
    local_3d8.numVertexAttribs = 2;
    local_3d8.vertexAttribs = (VertexAttrib *)local_598;
    local_3d8.state = &local_4c8;
    local_3d8.renderTarget = (RenderTarget *)local_3a0;
    local_3d8.primitives = &local_50;
    rr::Renderer::draw(&local_5d1,&local_3d8);
    sglr::ShaderProgram::~ShaderProgram((ShaderProgram *)local_1a8);
    rr::Renderer::~Renderer(&local_5d1);
    testCtx = (this->super_PolygonOffsetTestCase).super_TestCase.super_TestCase.super_TestNode.
              m_testCtx;
    pRVar3 = ((this->super_PolygonOffsetTestCase).super_TestCase.m_context)->m_renderCtx;
    local_1a8._0_4_ = RGBA;
    local_1a8._4_4_ = UNORM_INT8;
    if ((void *)local_5b8.m_pixels.m_cap != (void *)0x0) {
      local_5b8.m_pixels.m_cap = (size_t)local_5b8.m_pixels.m_ptr;
    }
    tcu::PixelBufferAccess::PixelBufferAccess
              ((PixelBufferAccess *)local_3a0,(TextureFormat *)local_1a8,local_5b8.m_width,
               local_5b8.m_height,1,(void *)local_5b8.m_pixels.m_cap);
    local_4c8.cullMode = RGBA;
    local_4c8.provokingVertexConvention = UNORM_INT8;
    if ((void *)local_5d0.m_pixels.m_cap != (void *)0x0) {
      local_5d0.m_pixels.m_cap = (size_t)local_5d0.m_pixels.m_ptr;
    }
    tcu::PixelBufferAccess::PixelBufferAccess
              ((PixelBufferAccess *)local_1a8,(TextureFormat *)&local_4c8,local_5d0.m_width,
               local_5d0.m_height,1,(void *)local_5d0.m_pixels.m_cap);
    verifyImages((TestLog *)TVar2,testCtx,pRVar3,(ConstPixelBufferAccess *)local_3a0,
                 (ConstPixelBufferAccess *)local_1a8);
    tcu::Surface::~Surface(&local_5d0);
    tcu::Surface::~Surface(&local_5b8);
    return;
  }
  glu::operator<<((TestLog *)TVar2,(ShaderProgram *)local_1a8);
  this_00 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_00,"Shader compile failed.",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fPolygonOffsetTests.cpp"
             ,0x17a);
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void UsageTestCase::testPolygonOffset (void)
{
	using tcu::TestLog;

	const tcu::Vec4 triangle[] =
	{
		tcu::Vec4(-1,  1,  0,  1),
		tcu::Vec4( 1,  1,  0,  1),
		tcu::Vec4( 1, -1,  0,  1),
	};

	tcu::TestLog&		log				= m_testCtx.getLog();
	tcu::Surface		testImage		(m_targetSize, m_targetSize);
	tcu::Surface		referenceImage	(m_targetSize, m_targetSize);

	// render test image
	{
		const glw::Functions&		gl			= m_context.getRenderContext().getFunctions();
		const glu::ShaderProgram	program		(m_context.getRenderContext(), glu::makeVtxFragSources(s_shaderSourceVertex, s_shaderSourceFragment));
		const GLint					positionLoc = gl.getAttribLocation(program.getProgram(), "a_position");
		const GLint					colorLoc	= gl.getAttribLocation(program.getProgram(), "a_color");

		if (!program.isOk())
		{
			log << program;
			TCU_FAIL("Shader compile failed.");
		}

		gl.clearColor				(0, 0, 0, 1);
		gl.clearDepthf				(1.0f);
		gl.clear					(GL_COLOR_BUFFER_BIT | GL_DEPTH_BUFFER_BIT);
		gl.viewport					(0, 0, m_targetSize, m_targetSize);
		gl.useProgram				(program.getProgram());
		gl.enable					(GL_DEPTH_TEST);
		gl.depthFunc				(GL_LEQUAL);	// make test pass if polygon offset doesn't do anything. It has its own test case. This test is only for to detect always-on cases.

		log << TestLog::Message << "DepthFunc = GL_LEQUAL" << TestLog::EndMessage;

		gl.enableVertexAttribArray	(positionLoc);
		gl.vertexAttribPointer		(positionLoc, 4, GL_FLOAT, GL_FALSE, 0, triangle);

		//draw back (offset disabled)

		log << TestLog::Message << "Draw bottom-right. Color = White.\tState: PolygonOffset(0, -2), POLYGON_OFFSET_FILL disabled." << TestLog::EndMessage;

		gl.polygonOffset			(0, -2);
		gl.disable					(GL_POLYGON_OFFSET_FILL);
		gl.vertexAttrib4f			(colorLoc, 1.0f, 1.0f, 1.0f, 1.0f);
		gl.drawArrays				(GL_TRIANGLES, 0, 3);

		//draw front

		log << TestLog::Message << "Draw bottom-right. Color = Red.\tState: PolygonOffset(0, -1), POLYGON_OFFSET_FILL enabled." << TestLog::EndMessage;

		gl.polygonOffset			(0, -1);
		gl.enable					(GL_POLYGON_OFFSET_FILL);
		gl.vertexAttrib4f			(colorLoc, 1.0f, 0.0f, 0.0f, 1.0f);
		gl.drawArrays				(GL_TRIANGLES, 0, 3);

		gl.disableVertexAttribArray	(positionLoc);
		gl.useProgram				(0);
		gl.finish					();

		glu::readPixels(m_context.getRenderContext(), 0, 0, testImage.getAccess());
	}

	// render reference image
	{
		rr::Renderer		referenceRenderer;
		rr::VertexAttrib	attribs[2];
		rr::RenderState		state((rr::ViewportState)(rr::WindowRectangle(0, 0, m_targetSize, m_targetSize)));

		PositionColorShader program;

		attribs[0].type				= rr::VERTEXATTRIBTYPE_FLOAT;
		attribs[0].size				= 4;
		attribs[0].stride			= 0;
		attribs[0].instanceDivisor	= 0;
		attribs[0].pointer			= triangle;

		attribs[1].type				= rr::VERTEXATTRIBTYPE_DONT_CARE;
		attribs[1].generic			= tcu::Vec4(1.0f, 0.0f, 0.0f, 1.0f);

		tcu::clear(referenceImage.getAccess(), tcu::Vec4(0.0f, 0.0f, 0.0f, 1.0f));

		log << TestLog::Message << "Expecting: Bottom-right = Red." << TestLog::EndMessage;

		referenceRenderer.draw(
			rr::DrawCommand(
				state,
				rr::RenderTarget(rr::MultisamplePixelBufferAccess::fromSinglesampleAccess(referenceImage.getAccess())),
				rr::Program(program.getVertexShader(), program.getFragmentShader()),
				2,
				attribs,
				rr::PrimitiveList(rr::PRIMITIVETYPE_TRIANGLES, 3, 0)));
	}

	// compare
	verifyImages(log, m_testCtx, m_context.getRenderContext(), testImage.getAccess(), referenceImage.getAccess());
}